

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

Literal * wasm::Literal::makeFromInt32(Literal *__return_storage_ptr__,int32_t x,Type type)

{
  BasicType BVar1;
  array<wasm::Literal,_4UL> local_80;
  int local_1c;
  Type TStack_18;
  int32_t x_local;
  Type type_local;
  
  local_1c = x;
  TStack_18.id = type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  BVar1 = Type::getBasic(&stack0xffffffffffffffe8);
  switch(BVar1) {
  case i32:
    Literal(__return_storage_ptr__,local_1c);
    break;
  case i64:
    Literal(__return_storage_ptr__,(long)local_1c);
    break;
  case f32:
    Literal(__return_storage_ptr__,(float)local_1c);
    break;
  case f64:
    Literal(__return_storage_ptr__,(double)local_1c);
    break;
  case v128:
    Literal(local_80._M_elems,local_1c);
    Literal(local_80._M_elems + 1,0);
    Literal(local_80._M_elems + 2,0);
    Literal(local_80._M_elems + 3,0);
    ::wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_80);
    std::array<wasm::Literal,_4UL>::~array(&local_80);
    break;
  default:
    ::wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
               ,0xba);
  }
  return __return_storage_ptr__;
}

Assistant:

static Literal makeFromInt32(int32_t x, Type type) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(int32_t(x));
      case Type::i64:
        return Literal(int64_t(x));
      case Type::f32:
        return Literal(float(x));
      case Type::f64:
        return Literal(double(x));
      case Type::v128:
        return Literal(std::array<Literal, 4>{{Literal(x),
                                               Literal(int32_t(0)),
                                               Literal(int32_t(0)),
                                               Literal(int32_t(0))}});
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }